

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall
helics::Federate::Federate
          (Federate *this,string_view fedName,shared_ptr<helics::Core> *core,FederateInfo *fedInfo)

{
  allocator<char> local_69;
  function<void_()> *local_68;
  function<void_(bool)> *local_60;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *local_58;
  function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *local_50;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = fedName._M_str;
  local_40._M_len = fedName._M_len;
  this->_vptr_Federate = (_func_int **)&PTR__Federate_004448c8;
  this->currentMode = STARTUP;
  this->nameSegmentSeparator = '/';
  this->strictConfigChecking = true;
  this->useJsonSerialization = false;
  this->observerMode = false;
  this->retriggerTimeRequest = false;
  this->singleThreadFederate = false;
  this->hasPotentialInterfaces = false;
  (this->fedID).fid = -2000000000;
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>,
             &core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>);
  (this->mCurrentTime).internalTimeCode = -0x7fffffffffffffff;
  (this->mStopTime).internalTimeCode = 0x7fffffffffffffff;
  (this->configFile)._M_dataplus._M_p = (pointer)&(this->configFile).field_2;
  (this->configFile)._M_string_length = 0;
  (this->configFile).field_2._M_local_buf[0] = '\0';
  (this->asyncCallInfo)._M_t.
  super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  .
  super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
  ._M_head_impl = (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)0x0;
  (this->cManager)._M_t.
  super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
  .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl =
       (ConnectorFederateManager *)0x0;
  *(undefined8 *)
   ((long)&(this->cManager)._M_t.
           super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
           .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl + 4) = 0;
  *(undefined8 *)
   ((long)&(this->potManager)._M_t.
           super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
           .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl + 4) = 0
  ;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->mName,&local_40,&local_69);
  local_48 = &this->timeUpdateCallback;
  local_50 = &this->modeUpdateCallback;
  local_58 = &this->timeRequestReturnCallback;
  local_60 = &this->initializingEntryCallback;
  local_68 = &this->executingEntryCallback;
  memset(&this->timeRequestEntryCallback,0,0x100);
  if ((this->mName)._M_string_length == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName,
               &fedInfo->defName);
  }
  getCore(this,fedInfo);
  verifyCore(this);
  registerFederate(this,fedInfo);
  return;
}

Assistant:

Federate::Federate(std::string_view fedName,
                   const std::shared_ptr<Core>& core,
                   const FederateInfo& fedInfo): coreObject(core), mName(fedName)
{
    if (mName.empty()) {
        mName = fedInfo.defName;
    }
    getCore(fedInfo);
    verifyCore();

    registerFederate(fedInfo);
}